

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGameCollaborativeGraphical.cpp
# Opt level: O0

string * __thiscall
BayesianGameCollaborativeGraphical::SoftPrint_abi_cxx11_(BayesianGameCollaborativeGraphical *this)

{
  ostream *poVar1;
  long in_RSI;
  string *in_RDI;
  Index e;
  stringstream ss;
  ostream *in_stack_fffffffffffffdb8;
  vector<BayesianGameIdenticalPayoff_*,_std::allocator<BayesianGameIdenticalPayoff_*>_>
  *in_stack_fffffffffffffdc0;
  string local_1f0 [32];
  string local_1d0 [52];
  uint local_19c;
  stringstream local_198 [16];
  ostream local_188 [224];
  Scope *in_stack_ffffffffffffff58;
  
  std::__cxx11::stringstream::stringstream(local_198);
  for (local_19c = 0; (ulong)local_19c < *(ulong *)(in_RSI + 0xd8); local_19c = local_19c + 1) {
    poVar1 = std::operator<<(local_188,"LRF function ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_19c);
    poVar1 = std::operator<<(poVar1,":");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    poVar1 = std::operator<<(local_188,"Agent scope ");
    std::vector<Scope,_std::allocator<Scope>_>::at
              ((vector<Scope,_std::allocator<Scope>_> *)in_stack_fffffffffffffdc0,
               (size_type)in_stack_fffffffffffffdb8);
    PrintTools::SoftPrintVector<Scope>(in_stack_ffffffffffffff58);
    poVar1 = std::operator<<(poVar1,local_1d0);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_1d0);
    in_stack_fffffffffffffdb8 = local_188;
    in_stack_fffffffffffffdc0 =
         (vector<BayesianGameIdenticalPayoff_*,_std::allocator<BayesianGameIdenticalPayoff_*>_> *)
         std::vector<BayesianGameIdenticalPayoff_*,_std::allocator<BayesianGameIdenticalPayoff_*>_>
         ::at(in_stack_fffffffffffffdc0,(size_type)in_stack_fffffffffffffdb8);
    (*(((value_type)
       (((_Vector_base<Scope,_std::allocator<Scope>_> *)
        &in_stack_fffffffffffffdc0->
         super__Vector_base<BayesianGameIdenticalPayoff_*,_std::allocator<BayesianGameIdenticalPayoff_*>_>
        )->_M_impl).super__Vector_impl_data._M_start)->super_BayesianGameIdenticalPayoffInterface).
      super_BayesianGameBase.super_Interface_ProblemToPolicyDiscretePure.
      super_Interface_ProblemToPolicyDiscrete._vptr_Interface_ProblemToPolicyDiscrete[0x12])
              (local_1f0);
    std::operator<<(in_stack_fffffffffffffdb8,local_1f0);
    std::__cxx11::string::~string(local_1f0);
    std::ostream::operator<<(local_188,std::endl<char,std::char_traits<char>>);
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_198);
  return in_RDI;
}

Assistant:

string BayesianGameCollaborativeGraphical::SoftPrint() const
{
    stringstream ss;
    //ss << BayesianGameBase::SoftPrint();    
    for(Index e=0; e < _m_nrLRFs; e++)
    {
        ss << "LRF function " << e << ":" << endl;
        ss << "Agent scope " << SoftPrintVector(_m_agentScopes.at(e)) << endl;
        ss << _m_LRFs.at(e)->SoftPrint();
        ss << endl;
    }
    return(ss.str());
}